

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O2

void canvas_loadbangabstractions(_glist *x)

{
  _glist *x_00;
  t_pd p_Var1;
  t_symbol *s;
  t_gotfn p_Var2;
  _gobj **pp_Var3;
  
  s = gensym("loadbang");
  pp_Var3 = &x->gl_list;
  while (x_00 = (_glist *)*pp_Var3, x_00 != (_glist *)0x0) {
    p_Var1 = (x_00->gl_obj).te_g.g_pd;
    if (p_Var1 == canvas_class) {
      if (x_00->gl_env == (_canvasenvironment *)0x0) {
        canvas_loadbangabstractions(x_00);
      }
      else {
        canvas_loadbang(x_00);
      }
    }
    else if (p_Var1 == clone_class) {
      p_Var2 = zgetfn((t_pd *)x_00,s);
      if (p_Var2 != (t_gotfn)0x0) {
        pd_vmess((t_pd *)x_00,s,"f",0);
      }
    }
    pp_Var3 = &(x_00->gl_obj).te_g.g_next;
  }
  return;
}

Assistant:

static void canvas_loadbangabstractions(t_canvas *x)
{
    t_gobj *y;
    t_symbol *s = gensym("loadbang");
    for (y = x->gl_list; y; y = y->g_next)
        if (pd_class(&y->g_pd) == canvas_class)
        {
            if (canvas_isabstraction((t_canvas *)y))
                canvas_loadbang((t_canvas *)y);
            else
                canvas_loadbangabstractions((t_canvas *)y);
        }
        else if ((pd_class(&y->g_pd) == clone_class) &&
            zgetfn(&y->g_pd, s))
        {
            pd_vmess(&y->g_pd, s, "f", (t_floatarg)LB_LOAD);
        }
}